

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall
QDirPrivate::QDirPrivate
          (QDirPrivate *this,QString *path,QStringList *nameFilters_,SortFlags sort_,
          Filters filters_)

{
  QString *pQVar1;
  long lVar2;
  QString *pQVar3;
  undefined4 in_register_0000000c;
  storage_type *psVar4;
  long lVar5;
  QString *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  psVar4 = (storage_type *)
           CONCAT44(in_register_0000000c,
                    sort_.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                    super_QFlagsStorage<QDir::SortFlag>.i);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QArrayDataPointer<QString>::QArrayDataPointer(&(this->nameFilters).d,&nameFilters_->d);
  (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
       (Int)sort_.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
  ;
  (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
       (Int)filters_.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = (QAbstractFileEngine *)0x0;
  QFileSystemEntry::QFileSystemEntry(&this->dirEntry);
  FileCache::FileCache(&this->fileCache);
  lVar5 = (path->d).size;
  if (lVar5 == 0) {
    pQVar1 = (QString *)QByteArrayView::lengthHelperCharArray(".",2);
    ba.m_data = psVar4;
    ba.m_size = (qsizetype)".";
    QString::fromLatin1((QString *)&local_48,pQVar1,ba);
  }
  else {
    local_48.d = (Data *)(path->d).d;
    local_48.ptr = (QString *)(path->d).ptr;
    local_48.size = lVar5;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  setPath(this,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  pQVar3 = (this->nameFilters).d.ptr;
  lVar5 = (this->nameFilters).d.size;
  lVar2 = lVar5 * 0x18;
  pQVar1 = pQVar3 + lVar5;
  pQVar3 = pQVar3 + 2;
  for (lVar5 = lVar5 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pQVar3[-2].d.size != 0) {
      pQVar6 = pQVar3 + -2;
      goto LAB_00136f16;
    }
    if (pQVar3[-1].d.size != 0) {
      pQVar6 = pQVar3 + -1;
      goto LAB_00136f16;
    }
    pQVar6 = pQVar3;
    if ((pQVar3->d).size != 0) goto LAB_00136f16;
    if (pQVar3[1].d.size != 0) {
      pQVar6 = pQVar3 + 1;
      goto LAB_00136f16;
    }
    pQVar3 = pQVar3 + 4;
    lVar2 = lVar2 + -0x60;
  }
  lVar2 = lVar2 / 0x18;
  pQVar6 = pQVar3 + -2;
  if (lVar2 == 1) {
LAB_00136fa5:
    if ((pQVar6->d).size == 0) {
      pQVar6 = pQVar1;
    }
LAB_00136f16:
    if (pQVar6 != pQVar1) goto LAB_00136f6b;
  }
  else {
    if (lVar2 == 3) {
      if (pQVar3[-2].d.size == 0) {
        pQVar6 = pQVar3 + -1;
        goto LAB_00136f96;
      }
      goto LAB_00136f16;
    }
    if (lVar2 == 2) {
LAB_00136f96:
      if ((pQVar6->d).size == 0) {
        pQVar6 = pQVar6 + 1;
        goto LAB_00136fa5;
      }
      goto LAB_00136f16;
    }
  }
  pQVar3 = (QString *)QByteArrayView::lengthHelperCharArray("*",2);
  ba_00.m_data = (storage_type *)pQVar1;
  ba_00.m_size = (qsizetype)"*";
  QString::fromLatin1((QString *)&local_60,pQVar3,ba_00);
  QList<QString>::QList<QString,void>((QList<QString> *)&local_48,(QString *)&local_60);
  QArrayDataPointer<QString>::operator=(&(this->nameFilters).d,&local_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
LAB_00136f6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDirPrivate::QDirPrivate(const QString &path, const QStringList &nameFilters_,
                         QDir::SortFlags sort_, QDir::Filters filters_)
    : QSharedData(), nameFilters(nameFilters_), sort(sort_), filters(filters_)
{
    setPath(path.isEmpty() ? QString::fromLatin1(".") : path);

    auto isEmpty = [](const auto &e) { return e.isEmpty(); };
    const bool empty = std::all_of(nameFilters.cbegin(), nameFilters.cend(), isEmpty);
    if (empty)
        nameFilters = QStringList(QString::fromLatin1("*"));
}